

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall Js::FunctionProxy::HasValidNonProfileEntryPoint(FunctionProxy *this)

{
  ushort uVar1;
  JavascriptMethod codeAddress;
  BOOL BVar2;
  uint uVar3;
  JavascriptMethod p_Var4;
  FunctionBody *this_00;
  bool bVar5;
  
  codeAddress = (JavascriptMethod)((this->m_defaultEntryPointInfo).ptr)->jsMethod;
  p_Var4 = GetOriginalEntryPoint_Unchecked(this);
  this_00 = GetFunctionBody(this);
  uVar1 = *(ushort *)&(this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45;
  if ((uVar1 >> 10 & 1) != 0) {
    if (((uVar1 >> 0xb & 1) != 0) && (uVar3 = FunctionBody::GetByteCodeCount(this_00), uVar3 == 0))
    {
      return codeAddress == WasmLibrary::WasmLazyTrapCallback ||
             codeAddress == InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk;
    }
    if (codeAddress == InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk) {
      return true;
    }
    BVar2 = IsAsmJsCodeGenThunk(codeAddress);
    if (BVar2 != 0) {
      return true;
    }
  }
  BVar2 = IsIntermediateCodeGenThunk(codeAddress);
  bVar5 = true;
  if ((BVar2 == 0) && (p_Var4 != codeAddress)) {
    if (codeAddress == DynamicProfileInfo::EnsureDynamicProfileInfoThunk) {
      BVar2 = FunctionBody::IsNativeOriginalEntryPoint(this_00);
      bVar5 = BVar2 != 0;
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool FunctionProxy::HasValidNonProfileEntryPoint() const
    {
        JavascriptMethod directEntryPoint = this->GetDefaultEntryPointInfo()->jsMethod;
        JavascriptMethod originalEntryPoint = this->GetOriginalEntryPoint_Unchecked();

        FunctionBody* body = this->GetFunctionBody();
        Unused(body); // in some configuration
#ifdef ASMJS_PLAT
        if (body->GetIsAsmJsFunction())
        {
#ifdef ENABLE_WASM
            if (body->IsWasmFunction() && body->GetByteCodeCount() == 0)
            {
                // The only valid 2 entrypoints if the function hasn't been parsed
                return directEntryPoint == AsmJsDefaultEntryThunk || directEntryPoint == WasmLibrary::WasmLazyTrapCallback;
            }
#endif
            // Entrypoints valid only for asm.js/wasm
            if (directEntryPoint == AsmJsDefaultEntryThunk || IsAsmJsCodeGenThunk(directEntryPoint))
            {
                return true;
            }
        }
#endif
        // Check the direct entry point to see if it is codegen thunk
        // if it is not, the background codegen thread has updated both original entry point and direct entry point
        // and they should still match, same as cases other then code gen
        return IsIntermediateCodeGenThunk(directEntryPoint) || originalEntryPoint == directEntryPoint
#if ENABLE_PROFILE_INFO
            || (directEntryPoint == DynamicProfileInfo::EnsureDynamicProfileInfoThunk && body->IsNativeOriginalEntryPoint())
#endif
            ;
    }